

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O2

int bip39_mnemonic_to_bytes(words *w,char *mnemonic,uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  size_t mask;
  size_t sVar2;
  uint uVar3;
  words *w_00;
  ulong len_00;
  size_t local_60;
  uchar tmp_bytes [42];
  
  w_00 = &en_words;
  if (w != (words *)0x0) {
    w_00 = w;
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (bytes_out == (uchar *)0x0) {
    return -2;
  }
  if (mnemonic == (char *)0x0) {
    return -2;
  }
  if (w_00->bits != 0xb) {
    return -2;
  }
  iVar1 = mnemonic_to_bytes(w_00,mnemonic,tmp_bytes,0x2a,&local_60);
  if (iVar1 != 0) goto LAB_00414427;
  len_00 = local_60 - 2;
  if (local_60 - 1 < 0x21) {
    len_00 = local_60 - 1;
  }
  iVar1 = -2;
  local_60 = len_00;
  if (0x2a < len_00) goto LAB_00414427;
  if (len < len_00) {
LAB_0041441d:
    iVar1 = 0;
  }
  else {
    mask = len_to_mask(len_00);
    if (mask != 0) {
      sVar2 = bip39_checksum(tmp_bytes,len_00,mask);
      uVar3 = (uint)tmp_bytes[len_00];
      if (0xff < mask) {
        uVar3 = (uint)CONCAT11(tmp_bytes[len_00 + 1],tmp_bytes[len_00]);
      }
      if ((uVar3 & (uint)mask) == sVar2) {
        memcpy(bytes_out,tmp_bytes,local_60);
        goto LAB_0041441d;
      }
    }
    local_60 = 0;
  }
LAB_00414427:
  wally_clear(tmp_bytes,0x2a);
  if (iVar1 == 0 && written != (size_t *)0x0) {
    *written = local_60;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int bip39_mnemonic_to_bytes(const struct words *w, const char *mnemonic,
                            unsigned char *bytes_out, size_t len,
                            size_t *written)
{
    unsigned char tmp_bytes[BIP39_ENTROPY_LEN_MAX];
    size_t mask, tmp_len;
    int ret;

    /* Ideally we would infer the wordlist here. Unfortunately this cannot
     * work reliably because the default word lists overlap. In combination
     * with being sorted lexographically, this means the default lists
     * were poorly chosen. But we are stuck with them now.
     *
     * If the caller doesn't know which word list to use, they should iterate
     * over the available ones and try any resulting list that the mnemonic
     * validates against.
     */
    w = w ? w : &en_words;

    if (written)
        *written = 0;

    if (w->bits != 11u || !mnemonic || !bytes_out)
        return WALLY_EINVAL;

    ret = mnemonic_to_bytes(w, mnemonic, tmp_bytes, sizeof(tmp_bytes), &tmp_len);

    if (!ret) {
        /* Remove checksum bytes from the output length */
        --tmp_len;
        if (tmp_len > BIP39_ENTROPY_LEN_256)
            --tmp_len; /* Second byte required */

        if (tmp_len > sizeof(tmp_bytes))
            ret = WALLY_EINVAL; /* Too big for biggest supported entropy */
        else {
            if (tmp_len <= len) {
                if (!(mask = len_to_mask(tmp_len)) ||
                    !checksum_ok(tmp_bytes, tmp_len, mask)) {
                    tmp_len = 0;
                    ret = WALLY_EINVAL; /* Bad checksum */
                }
                else
                    memcpy(bytes_out, tmp_bytes, tmp_len);
            }
        }
    }

    wally_clear(tmp_bytes, sizeof(tmp_bytes));
    if (!ret && written)
        *written = tmp_len;
    return ret;
}